

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O1

bool __thiscall duckdb::PhysicalTableScan::Equals(PhysicalTableScan *this,PhysicalOperator *other_p)

{
  pointer pCVar1;
  PhysicalTableScan *pPVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  
  if (((this->super_PhysicalOperator).type == other_p->type) &&
     (pPVar2 = PhysicalOperator::Cast<duckdb::PhysicalTableScan>(other_p),
     (this->function).function == (pPVar2->function).function)) {
    pCVar3 = (this->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar1 = (this->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar4 = (pPVar2->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)pCVar1 - (long)pCVar3 ==
        (long)(pPVar2->column_ids).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pCVar4) {
      bVar5 = pCVar3 == pCVar1;
      if (bVar5) {
LAB_01702487:
        if (bVar5) {
          bVar5 = FunctionData::Equals
                            ((this->bind_data).
                             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
                             (pPVar2->bind_data).
                             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
          return bVar5;
        }
      }
      else if (pCVar3->index == pCVar4->index) {
        do {
          pCVar4 = pCVar4 + 1;
          pCVar3 = pCVar3 + 1;
          bVar5 = pCVar3 == pCVar1;
          if (bVar5) goto LAB_01702487;
        } while (pCVar3->index == pCVar4->index);
      }
    }
  }
  return false;
}

Assistant:

bool PhysicalTableScan::Equals(const PhysicalOperator &other_p) const {
	if (type != other_p.type) {
		return false;
	}
	auto &other = other_p.Cast<PhysicalTableScan>();
	if (function.function != other.function.function) {
		return false;
	}
	if (column_ids != other.column_ids) {
		return false;
	}
	if (!FunctionData::Equals(bind_data.get(), other.bind_data.get())) {
		return false;
	}
	return true;
}